

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void cleanup_names(void)

{
  int local_10;
  int local_c;
  wchar_t j;
  wchar_t i;
  
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    for (local_10 = 0; name_sections[local_c][local_10] != (char *)0x0; local_10 = local_10 + 1) {
      string_free(name_sections[local_c][local_10]);
    }
    mem_free(name_sections[local_c]);
  }
  mem_free(name_sections);
  return;
}

Assistant:

static void cleanup_names(void)
{
	int i, j;
	for (i = 0; i < RANDNAME_NUM_TYPES; i++) {
		for (j = 0; name_sections[i][j]; j++) {
			string_free((char *)name_sections[i][j]);
		}
		mem_free(name_sections[i]);
	}
	mem_free(name_sections);
}